

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O0

int main(void)

{
  int iVar1;
  double dVar2;
  float local_108 [2];
  mat4x4 mvp;
  mat4x4 p;
  mat4x4 m;
  int local_40;
  int local_3c;
  int height;
  int width;
  float ratio;
  GLint vcol_location;
  GLint vpos_location;
  GLint mvp_location;
  GLuint program;
  GLuint fragment_shader;
  GLuint vertex_shader;
  GLuint vertex_buffer;
  GLFWwindow *window;
  
  window._4_4_ = 0;
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    exit(1);
  }
  glfwWindowHint(0x22002,2);
  glfwWindowHint(0x22003,0);
  _vertex_shader =
       glfwCreateWindow(0x280,0x1e0,"Simple example",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (_vertex_shader == (GLFWwindow *)0x0) {
    glfwTerminate();
    exit(1);
  }
  glfwSetKeyCallback(_vertex_shader,key_callback);
  glfwMakeContextCurrent(_vertex_shader);
  gladLoadGLLoader(glfwGetProcAddress);
  glfwSwapInterval(1);
  (*glad_glGenBuffers)(1,&fragment_shader);
  (*glad_glBindBuffer)(0x8892,fragment_shader);
  (*glad_glBufferData)(0x8892,0x3c,vertices,0x88e4);
  program = (*glad_glCreateShader)(0x8b31);
  (*glad_glShaderSource)(program,1,&vertex_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(program);
  mvp_location = (*glad_glCreateShader)(0x8b30);
  (*glad_glShaderSource)(mvp_location,1,&fragment_shader_text,(GLint *)0x0);
  (*glad_glCompileShader)(mvp_location);
  vpos_location = (*glad_glCreateProgram)();
  (*glad_glAttachShader)(vpos_location,program);
  (*glad_glAttachShader)(vpos_location,mvp_location);
  (*glad_glLinkProgram)(vpos_location);
  vcol_location = (*glad_glGetUniformLocation)(vpos_location,"MVP");
  ratio = (float)(*glad_glGetAttribLocation)(vpos_location,"vPos");
  width = (*glad_glGetAttribLocation)(vpos_location,"vCol");
  (*glad_glEnableVertexAttribArray)((GLuint)ratio);
  (*glad_glVertexAttribPointer)((GLuint)ratio,2,0x1406,'\0',0x14,(void *)0x0);
  (*glad_glEnableVertexAttribArray)(width);
  (*glad_glVertexAttribPointer)(width,3,0x1406,'\0',0x14,(void *)0x8);
  while( true ) {
    iVar1 = glfwWindowShouldClose(_vertex_shader);
    if (iVar1 != 0) break;
    glfwGetFramebufferSize(_vertex_shader,&local_3c,&local_40);
    height = (int)((float)local_3c / (float)local_40);
    (*glad_glViewport)(0,0,local_3c,local_40);
    (*glad_glClear)(0x4000);
    mat4x4_identity((vec4 *)(p[3] + 2));
    dVar2 = glfwGetTime();
    mat4x4_rotate_Z((vec4 *)(p[3] + 2),(vec4 *)(p[3] + 2),(float)dVar2);
    mat4x4_ortho((vec4 *)(mvp[3] + 2),-(float)height,(float)height,-1.0,1.0,1.0,-1.0);
    mat4x4_mul((vec4 *)local_108,(vec4 *)(mvp[3] + 2),(vec4 *)(p[3] + 2));
    (*glad_glUseProgram)(vpos_location);
    (*glad_glUniformMatrix4fv)(vcol_location,1,'\0',local_108);
    (*glad_glDrawArrays)(4,0,3);
    glfwSwapBuffers(_vertex_shader);
    glfwPollEvents();
  }
  glfwDestroyWindow(_vertex_shader);
  glfwTerminate();
  exit(0);
}

Assistant:

int main(void)
{
    GLFWwindow* window;
    GLuint vertex_buffer, vertex_shader, fragment_shader, program;
    GLint mvp_location, vpos_location, vcol_location;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 2);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 0);

    window = glfwCreateWindow(640, 480, "Simple example", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwSetKeyCallback(window, key_callback);

    glfwMakeContextCurrent(window);
    gladLoadGLLoader((GLADloadproc) glfwGetProcAddress);
    glfwSwapInterval(1);

    // NOTE: OpenGL error checks have been omitted for brevity

    glGenBuffers(1, &vertex_buffer);
    glBindBuffer(GL_ARRAY_BUFFER, vertex_buffer);
    glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);

    vertex_shader = glCreateShader(GL_VERTEX_SHADER);
    glShaderSource(vertex_shader, 1, &vertex_shader_text, NULL);
    glCompileShader(vertex_shader);

    fragment_shader = glCreateShader(GL_FRAGMENT_SHADER);
    glShaderSource(fragment_shader, 1, &fragment_shader_text, NULL);
    glCompileShader(fragment_shader);

    program = glCreateProgram();
    glAttachShader(program, vertex_shader);
    glAttachShader(program, fragment_shader);
    glLinkProgram(program);

    mvp_location = glGetUniformLocation(program, "MVP");
    vpos_location = glGetAttribLocation(program, "vPos");
    vcol_location = glGetAttribLocation(program, "vCol");

    glEnableVertexAttribArray(vpos_location);
    glVertexAttribPointer(vpos_location, 2, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) 0);
    glEnableVertexAttribArray(vcol_location);
    glVertexAttribPointer(vcol_location, 3, GL_FLOAT, GL_FALSE,
                          sizeof(vertices[0]), (void*) (sizeof(float) * 2));

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;
        mat4x4 m, p, mvp;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        mat4x4_identity(m);
        mat4x4_rotate_Z(m, m, (float) glfwGetTime());
        mat4x4_ortho(p, -ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        mat4x4_mul(mvp, p, m);

        glUseProgram(program);
        glUniformMatrix4fv(mvp_location, 1, GL_FALSE, (const GLfloat*) mvp);
        glDrawArrays(GL_TRIANGLES, 0, 3);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}